

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

Object * __thiscall GCPtr<symbols::Object>::operator=(GCPtr<symbols::Object> *this,Object *t)

{
  bool bVar1;
  pointer pGVar2;
  undefined1 local_48 [8];
  GCInfo<symbols::Object> gcObj;
  _List_iterator<GCInfo<symbols::Object>_> local_20;
  iterator p;
  Object *t_local;
  GCPtr<symbols::Object> *this_local;
  
  p._M_node = (_List_node_base *)t;
  std::_List_iterator<GCInfo<symbols::Object>_>::_List_iterator(&local_20);
  local_20._M_node = (_List_node_base *)findPtrInfo(this,this->addr);
  pGVar2 = std::_List_iterator<GCInfo<symbols::Object>_>::operator->(&local_20);
  pGVar2->refcount = pGVar2->refcount - 1;
  local_20._M_node = (_List_node_base *)findPtrInfo(this,p._M_node);
  gcObj.memPtr = (Object *)
                 std::__cxx11::
                 list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::end
                           (&gclist_abi_cxx11_);
  bVar1 = std::operator==(&local_20,(_Self *)&gcObj.memPtr);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    GCInfo<symbols::Object>::GCInfo((GCInfo<symbols::Object> *)local_48,(Object *)p._M_node);
    std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::
    push_front(&gclist_abi_cxx11_,(value_type *)local_48);
  }
  else {
    pGVar2 = std::_List_iterator<GCInfo<symbols::Object>_>::operator->(&local_20);
    pGVar2->refcount = pGVar2->refcount + 1;
  }
  this->addr = (Object *)p._M_node;
  return (Object *)p._M_node;
}

Assistant:

T * GCPtr<T>::operator=(T *t){

    typename list<GCInfo<T>>::iterator p;
    // First, decrement the reference count
    // for the memory currently being pointed to.
    p = findPtrInfo(addr);
    p->refcount--;
    // Next, if the new address is already
    // existent in the system, increment its
    // count. Otherwise, create a new entry
    // for gclist.
    p = findPtrInfo(t);
    if(p != gclist.end())
        p->refcount++;
    else {
        // Create and store this entry.
        GCInfo<T> gcObj(t);
        gclist.push_front(gcObj);
    }
    addr = t; // store the address.
    return t;
}